

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

int __thiscall lattice::graph::init(graph *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_type sVar4;
  invalid_argument *this_00;
  bond_t *pbVar5;
  unitcell *b;
  const_reference pvVar6;
  Scalar *pSVar7;
  long lVar8;
  unitcell *this_01;
  supercell *in_RCX;
  unitcell *in_RDX;
  vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_> *in_R8;
  size_t t_1;
  size_t m;
  bool valid;
  offset_t cross;
  size_t target_cell;
  size_t s;
  size_t u;
  size_t c_1;
  coordinate_t pos;
  size_t t;
  offset_t cell_offset;
  size_t c;
  unitcell *in_stack_fffffffffffffdf8;
  unitcell *in_stack_fffffffffffffe00;
  bond_t *in_stack_fffffffffffffe08;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffe10;
  supercell *in_stack_fffffffffffffe18;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffe20;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffe28;
  ulong uVar9;
  int tp;
  undefined8 in_stack_fffffffffffffe60;
  ulong t_00;
  site_t *in_stack_fffffffffffffe68;
  graph *in_stack_fffffffffffffe70;
  ulong local_150;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *local_108;
  ulong local_f8;
  ulong local_f0;
  offset_t *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  supercell *in_stack_ffffffffffffff88;
  ulong local_58;
  ulong local_40;
  
  sVar2 = unitcell::dimension(in_RDX);
  sVar3 = supercell::dimension(in_RCX);
  if (sVar2 == sVar3) {
    sVar2 = unitcell::dimension(in_RDX);
    sVar4 = std::vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>::size(in_R8);
    if (sVar2 == sVar4) {
      sVar2 = unitcell::dimension(in_RDX);
      this->dim_ = sVar2;
      std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::clear
                ((vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_> *)0x1082ab
                );
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::clear((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)0x1082bc);
      std::vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>::clear
                ((vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_> *)0x1082cd
                );
      for (local_40 = 0; sVar2 = supercell::num_cells(in_RCX), local_40 < sVar2;
          local_40 = local_40 + 1) {
        supercell::offset(in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10);
        for (local_58 = 0; sVar2 = unitcell::num_sites((unitcell *)0x108350), local_58 < sVar2;
            local_58 = local_58 + 1) {
          basis::basis_vectors((basis *)in_stack_fffffffffffffdf8);
          Eigen::DenseBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::cast<double>
                    ((DenseBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffe18);
          in_stack_fffffffffffffe70 =
               (graph *)unitcell::site(in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
          Eigen::
          MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,double>,Eigen::Matrix<long,-1,1,0,-1,1>const>>
          ::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
          Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
          Eigen::Matrix<double,-1,1,0,-1,1>::
          Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,double>,Eigen::Matrix<long,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,0>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe00,
                     (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                      *)in_stack_fffffffffffffdf8);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)0x10840d);
          in_stack_fffffffffffffe68 =
               unitcell::site(in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
          add_site(in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->coordinate,
                   (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                    ((Matrix<double,__1,_1,_0,__1,_1> *)0x108455);
        }
        Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x1084d7);
      }
      local_f0 = 0;
      while (t_00 = local_f0, sVar2 = supercell::num_cells(in_RCX), t_00 < sVar2) {
        local_f8 = 0;
        while (uVar9 = local_f8, sVar2 = unitcell::num_bonds((unitcell *)0x10855f), uVar9 < sVar2) {
          sVar2 = unitcell::num_sites((unitcell *)0x10858a);
          pbVar5 = unitcell::bond(in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
          b = (unitcell *)(local_f0 * sVar2 + pbVar5->source);
          Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x1085d3);
          unitcell::bond(in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
          supercell::add_offset
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          std::tie<unsigned_long,Eigen::Matrix<long,_1,1,0,_1,1>>
                    (&in_stack_fffffffffffffe08->source,
                     (Matrix<long,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe00);
          std::tuple<unsigned_long&,Eigen::Matrix<long,-1,1,0,-1,1>&>::operator=
                    ((tuple<unsigned_long_&,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_&> *)
                     in_stack_fffffffffffffe10,
                     (pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)
                     in_stack_fffffffffffffe08);
          std::pair<unsigned_long,_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::~pair
                    ((pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)0x10866a);
          bVar1 = true;
          for (local_150 = 0; tp = (int)(uVar9 >> 0x20), local_150 < this->dim_;
              local_150 = local_150 + 1) {
            pvVar6 = std::vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>::
                     operator[](in_R8,local_150);
            if ((*pvVar6 == open) &&
               (pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *)
                                    in_stack_fffffffffffffe00,(Index)in_stack_fffffffffffffdf8),
               *pSVar7 != 0)) {
              bVar1 = false;
            }
          }
          if (bVar1) {
            in_stack_fffffffffffffe10 = local_108;
            sVar2 = unitcell::num_sites((unitcell *)0x10874b);
            lVar8 = (long)in_stack_fffffffffffffe10 * sVar2;
            pbVar5 = unitcell::bond(in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
            this_01 = (unitcell *)(lVar8 + pbVar5->target);
            if (b != this_01) {
              in_stack_fffffffffffffe08 = unitcell::bond(this_01,(size_t)b);
              add_bond(in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68,t_00,tp);
              in_stack_fffffffffffffdf8 = b;
              in_stack_fffffffffffffe00 = this_01;
            }
          }
          Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x108806);
          local_f8 = local_f8 + 1;
        }
        local_f0 = local_f0 + 1;
      }
      return (int)t_00;
    }
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"dimension mismatch");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void init(const basis& bs, const unitcell& cell, const supercell& super,
            const std::vector<boundary_t>& boundary) {
    if (cell.dimension() != super.dimension() || cell.dimension() != boundary.size())
      throw std::invalid_argument("dimension mismatch");

    dim_ = cell.dimension();
    sites_.clear();
    coordinates_.clear();
    bonds_.clear();

    for (std::size_t c = 0; c < super.num_cells(); ++c) {
      auto cell_offset = super.offset(c);
      for (std::size_t t = 0; t < cell.num_sites(); ++t) {
        coordinate_t pos = bs.basis_vectors() *
          (cell_offset.cast<double>() + cell.site(t).coordinate);
        add_site(pos, cell.site(t).type);
      }
    }
    for (std::size_t c = 0; c < super.num_cells(); ++c) {
      for (std::size_t u = 0; u < cell.num_bonds(); ++u) {
        std::size_t s = c * cell.num_sites() + cell.bond(u).source;
        std::size_t target_cell;
        offset_t cross;
        std::tie(target_cell, cross) = super.add_offset(c, cell.bond(u).target_offset);
        bool valid = true;
        for (std::size_t m = 0; m < dim_; ++m)
          if (boundary[m] == boundary_t::open && cross(m) != 0) valid = false;
        if (valid) {
          std::size_t t = target_cell * cell.num_sites() + cell.bond(u).target;
          if (s != t) add_bond(s, t, cell.bond(u).type);
        }
      }
    }
  }